

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examine_stack.cc
# Opt level: O3

void absl::lts_20250127::debugging_internal::DumpPCAndFrameSizesAndStackTrace
               (void *pc,void **stack,int *frame_sizes,int depth,int min_dropped_frames,
               bool symbolize_stacktrace,OutputWriter *writer,void *writer_arg)

{
  char *__format;
  ulong uVar1;
  char local_98 [104];
  
  if (pc != (void *)0x0) {
    if (symbolize_stacktrace) {
      anon_unknown_0::DumpPCAndFrameSizeAndSymbol(writer,writer_arg,pc,pc,0,"PC: ");
    }
    else {
      snprintf(local_98,100,"%s@ %*p  (unknown)\n","PC: ",0x12,pc);
      (*writer)(local_98,writer_arg);
    }
  }
  if (0 < depth) {
    uVar1 = 0;
    do {
      if (symbolize_stacktrace) {
        anon_unknown_0::DumpPCAndFrameSizeAndSymbol
                  (writer,writer_arg,stack[uVar1],(void *)((long)stack[uVar1] + -1),
                   frame_sizes[uVar1],"    ");
      }
      else {
        if (frame_sizes[uVar1] < 1) {
          __format = "%s@ %*p  (unknown)\n";
        }
        else {
          __format = "%s@ %*p  %9d\n";
        }
        snprintf(local_98,100,__format,"    ",0x12);
        (*writer)(local_98,writer_arg);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)depth != uVar1);
  }
  if (0 < min_dropped_frames) {
    snprintf(local_98,100,"    @ ... and at least %d more frames\n");
    (*writer)(local_98,writer_arg);
  }
  return;
}

Assistant:

void DumpPCAndFrameSizesAndStackTrace(void* const pc, void* const stack[],
                                      int frame_sizes[], int depth,
                                      int min_dropped_frames,
                                      bool symbolize_stacktrace,
                                      OutputWriter* writer, void* writer_arg) {
  if (pc != nullptr) {
    // We don't know the stack frame size for PC, use 0.
    if (symbolize_stacktrace) {
      DumpPCAndFrameSizeAndSymbol(writer, writer_arg, pc, pc, 0, "PC: ");
    } else {
      DumpPCAndFrameSize(writer, writer_arg, pc, 0, "PC: ");
    }
  }
  for (int i = 0; i < depth; i++) {
    if (symbolize_stacktrace) {
      // Pass the previous address of pc as the symbol address because pc is a
      // return address, and an overrun may occur when the function ends with a
      // call to a function annotated noreturn (e.g. CHECK). Note that we don't
      // do this for pc above, as the adjustment is only correct for return
      // addresses.
      DumpPCAndFrameSizeAndSymbol(writer, writer_arg, stack[i],
                                  reinterpret_cast<char*>(stack[i]) - 1,
                                  frame_sizes[i], "    ");
    } else {
      DumpPCAndFrameSize(writer, writer_arg, stack[i], frame_sizes[i], "    ");
    }
  }
  if (min_dropped_frames > 0) {
    char buf[100];
    snprintf(buf, sizeof(buf), "    @ ... and at least %d more frames\n",
             min_dropped_frames);
    writer(buf, writer_arg);
  }
}